

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

size_t __thiscall mocker::ir::Interpreter::executeInst(Interpreter *this,size_t idx)

{
  long val_;
  FuncModule *pFVar1;
  shared_ptr<mocker::ir::Addr> *psVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  __shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int64_t iVar7;
  ulong uVar8;
  ulong uVar9;
  int64_t iVar10;
  long *plVar11;
  int64_t *piVar12;
  void *pvVar13;
  size_t sz;
  mapped_type *pmVar14;
  const_reference v;
  _Elt_pointer pAVar15;
  _Elt_pointer pAVar16;
  shared_ptr<mocker::ir::Addr> *argReg;
  shared_ptr<mocker::ir::Addr> *reg;
  __shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar17;
  shared_ptr<mocker::ir::Label> nxtLabel;
  shared_ptr<mocker::ir::Assign> p;
  value_type inst;
  shared_ptr<mocker::ir::Phi> phi;
  
  pAVar16 = (this->ars).c.
            super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pAVar16 ==
      (this->ars).c.
      super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pAVar16 = (this->ars).c.
              super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
  }
  p_Var6 = &std::
            vector<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
            ::at(&(pAVar16[-1].curFunc._M_data)->insts,idx)->
            super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
  this_00 = &inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(this_00,p_Var6);
  dyc<mocker::ir::Assign,std::shared_ptr<mocker::ir::IRInst>&>
            ((ir *)&p,(shared_ptr<mocker::ir::IRInst> *)this_00);
  peVar4 = p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar7 = readVal(this,&(p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->operand);
    std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Reg,void>
              ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
               &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Definition).dest.
                super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
    writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,iVar7);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&nxtLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    this_00 = (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)(idx + 1);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (peVar4 == (element_type *)0x0) {
    dyc<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::IRInst>&>((ir *)&p,&inst);
    peVar4 = p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      uVar8 = readVal(this,(shared_ptr<mocker::ir::Addr> *)
                           &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->operand).
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
      std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::Reg,void>
                ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                 &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Definition).dest.
                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
      uVar9 = ~uVar8;
      if (*(int *)&((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   operand).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == 0) {
        uVar9 = -uVar8;
      }
      writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,uVar9);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&nxtLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_00 = (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)(idx + 1);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (peVar4 == (element_type *)0x0) {
      dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>&>((ir *)&p,&inst);
      peVar4 = p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        uVar9 = readVal(this,(shared_ptr<mocker::ir::Addr> *)
                             &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->operand).
                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
        uVar8 = readVal(this,(shared_ptr<mocker::ir::Addr> *)
                             &p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr[1].super_IRInst.type);
        switch(*(undefined4 *)
                &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 operand).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
        case 0:
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Reg,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                     &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Definition).dest.
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,uVar8 | uVar9);
          break;
        case 1:
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Reg,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                     &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Definition).dest.
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,uVar8 & uVar9);
          break;
        case 2:
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Reg,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                     &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Definition).dest.
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,uVar8 ^ uVar9);
          break;
        case 3:
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Reg,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                     &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Definition).dest.
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,
                         uVar9 << ((byte)uVar8 & 0x3f));
          break;
        case 4:
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Reg,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                     &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Definition).dest.
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,
                         (long)uVar9 >> ((byte)uVar8 & 0x3f));
          break;
        case 5:
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Reg,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                     &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Definition).dest.
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,uVar8 + uVar9);
          break;
        case 6:
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Reg,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                     &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Definition).dest.
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,uVar9 - uVar8);
          break;
        case 7:
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Reg,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                     &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Definition).dest.
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,uVar8 * uVar9);
          break;
        case 8:
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Reg,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                     &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Definition).dest.
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,(long)uVar9 / (long)uVar8);
          break;
        case 9:
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Reg,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                     &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Definition).dest.
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,(long)uVar9 % (long)uVar8);
          break;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                        ,0x200,"std::size_t mocker::ir::Interpreter::executeInst(std::size_t)");
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&nxtLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_00 = (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)(idx + 1);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (peVar4 == (element_type *)0x0) {
        dyc<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::IRInst>&>((ir *)&p,&inst);
        peVar4 = p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          iVar7 = readVal(this,(shared_ptr<mocker::ir::Addr> *)
                               &((p.
                                  super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->operand).
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
          iVar10 = readVal(this,(shared_ptr<mocker::ir::Addr> *)
                                &p.
                                 super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr[1].super_IRInst.type);
          switch(*(undefined4 *)
                  &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   operand).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          {
          case 0:
            bVar17 = iVar7 == iVar10;
            break;
          case 1:
            bVar17 = iVar7 != iVar10;
            break;
          case 2:
            bVar17 = iVar7 < iVar10;
            break;
          case 3:
            bVar17 = iVar10 < iVar7;
            break;
          case 4:
            bVar17 = iVar7 <= iVar10;
            break;
          case 5:
            bVar17 = iVar10 <= iVar7;
            break;
          default:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                          ,0x21b,"std::size_t mocker::ir::Interpreter::executeInst(std::size_t)");
          }
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Reg,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                     &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Definition).dest.
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,(ulong)bVar17);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&nxtLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this_00 = (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)(idx + 1);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        if (peVar4 == (element_type *)0x0) {
          dyc<mocker::ir::Load,std::shared_ptr<mocker::ir::IRInst>&>((ir *)&p,&inst);
          peVar4 = p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            plVar11 = (long *)readVal(this,&(p.
                                             super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->operand);
            val_ = *plVar11;
            std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<mocker::ir::Reg,void>
                      ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                       &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_Definition).dest.
                        super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
            writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,val_);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&nxtLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            this_00 = (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)(idx + 1);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (peVar4 == (element_type *)0x0) {
            dyc<mocker::ir::Store,std::shared_ptr<mocker::ir::IRInst>&>((ir *)&p,&inst);
            peVar4 = p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              iVar7 = readVal(this,(shared_ptr<mocker::ir::Addr> *)
                                   &((p.
                                      super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->super_Definition).dest.
                                    super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
              piVar12 = (int64_t *)
                        readVal(this,(shared_ptr<mocker::ir::Addr> *)
                                     &(p.
                                       super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_Definition);
              *piVar12 = iVar7;
              this_00 = (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)(idx + 1);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if (peVar4 == (element_type *)0x0) {
              dyc<mocker::ir::Alloca,std::shared_ptr<mocker::ir::IRInst>&>((ir *)&p,&inst);
              peVar4 = p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                pvVar13 = fastMalloc(this,8);
                std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<mocker::ir::Reg,void>
                          ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                           &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Definition).dest.
                            super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
                writeReg<void*>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,pvVar13);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&nxtLabel.
                            super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                this_00 = (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)(idx + 1);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              if (peVar4 == (element_type *)0x0) {
                dyc<mocker::ir::Malloc,std::shared_ptr<mocker::ir::IRInst>&>((ir *)&p,&inst);
                peVar4 = p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                ;
                if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  sz = readVal(this,&(p.
                                      super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->operand);
                  pvVar13 = fastMalloc(this,sz);
                  std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr<mocker::ir::Reg,void>
                            ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&nxtLabel,
                             &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_Definition).dest.
                              super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
                  writeReg<void*>(this,(shared_ptr<mocker::ir::Addr> *)&nxtLabel,pvVar13);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&nxtLabel.
                              super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  this_00 = (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                            (idx + 1);
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                if (peVar4 == (element_type *)0x0) {
                  dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>&>((ir *)&p,&inst);
                  peVar4 = p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                  if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                      (element_type *)0x0) {
                    iVar7 = readVal(this,(shared_ptr<mocker::ir::Addr> *)
                                         &((p.
                                            super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->super_Definition).dest);
                    std::__shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                              (&nxtLabel.
                                super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>,
                               (__shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2> *)
                               (&(p.
                                  super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->operand + (iVar7 == 0)));
                    pFVar1 = pAVar16[-1].curFunc._M_data;
                    pAVar16[-1].lastBB = pAVar16[-1].curBB;
                    phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)
                         (nxtLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->id;
                    pAVar16[-1].curBB =
                         (size_t)phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                    pmVar14 = std::__detail::
                              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&pFVar1->label2idx,(key_type *)&phi);
                    this_00 = (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                              *pmVar14;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&nxtLabel.
                                super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                  }
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  if (peVar4 == (element_type *)0x0) {
                    dyc<mocker::ir::Jump,std::shared_ptr<mocker::ir::IRInst>&>((ir *)&p,&inst);
                    peVar4 = p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        != (element_type *)0x0) {
                      pFVar1 = pAVar16[-1].curFunc._M_data;
                      pAVar16[-1].lastBB = pAVar16[-1].curBB;
                      nxtLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr = (element_type *)
                               ((((p.
                                   super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_Definition).dest.
                                 super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->identifier)._M_dataplus._M_p;
                      pAVar16[-1].curBB =
                           (size_t)nxtLabel.
                                   super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr;
                      pmVar14 = std::__detail::
                                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&pFVar1->label2idx,(key_type *)&nxtLabel);
                      this_00 = (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                                *pmVar14;
                    }
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    if (peVar4 == (element_type *)0x0) {
                      dyc<mocker::ir::Ret,std::shared_ptr<mocker::ir::IRInst>&>((ir *)&p,&inst);
                      peVar4 = p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr;
                      if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr != (element_type *)0x0) {
                        if (((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Definition).dest.
                            super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            != (element_type *)0x0) {
                          iVar7 = readVal(this,(shared_ptr<mocker::ir::Addr> *)
                                               &((p.
                                                  super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->super_Definition).dest);
                          pAVar15 = (this->ars).c.
                                    super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                          if (pAVar15 ==
                              (this->ars).c.
                              super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                            pAVar15 = (this->ars).c.
                                      super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
                          }
                          pAVar15[-1].retVal = iVar7;
                        }
                        pFVar1 = pAVar16[-1].curFunc._M_data;
                        this_00 = (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                                  ((long)(pFVar1->insts).
                                         super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pFVar1->insts).
                                         super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4);
                      }
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&p.
                                  super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      if (peVar4 == (element_type *)0x0) {
                        dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>&>
                                  ((ir *)&nxtLabel,&inst);
                        peVar3 = nxtLabel.
                                 super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr;
                        if (nxtLabel.
                            super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            != (element_type *)0x0) {
                          p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr = (element_type *)0x0;
                          p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                          psVar2 = (shared_ptr<mocker::ir::Addr> *)
                                   nxtLabel.
                                   super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr[5].super_Addr._vptr_Addr;
                          for (reg = (shared_ptr<mocker::ir::Addr> *)
                                     nxtLabel.
                                     super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr[4].id; reg != psVar2; reg = reg + 1) {
                            phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr = (element_type *)readVal(this,reg);
                            std::vector<long,_std::allocator<long>_>::emplace_back<long>
                                      ((vector<long,_std::allocator<long>_> *)&p,(long *)&phi);
                          }
                          iVar7 = executeFunc(this,(string *)
                                                   &nxtLabel.
                                                  super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr[2].id,
                                              (vector<long,_std::allocator<long>_> *)&p);
                          if (nxtLabel.
                              super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr[1].id != 0) {
                            std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr<mocker::ir::Reg,void>
                                      ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)
                                       &phi,(__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                                             *)&nxtLabel.
                                                super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr[1].id);
                            writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&phi,iVar7);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&phi.
                                        super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                          }
                          this_00 = (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                                    (idx + 1);
                          std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                                    ((_Vector_base<long,_std::allocator<long>_> *)&p);
                        }
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&nxtLabel.
                                    super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                        if (peVar3 == (element_type *)0x0) {
                          dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>
                                    ((ir *)&nxtLabel,&inst);
                          peVar3 = nxtLabel.
                                   super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr;
                          if (nxtLabel.
                              super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr != (element_type *)0x0) {
                            p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr = (element_type *)0x0;
                            p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                            do {
                              v = std::
                                  vector<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                                  ::at(&(pAVar16[-1].curFunc._M_data)->insts,idx);
                              dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
                                        ((ir *)&phi,v);
                              peVar5 = phi.
                                       super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              if (phi.
                                  super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr == (element_type *)0x0) {
                                executePhis(this,(vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                                                  *)&p);
                                this_00 = (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                           *)idx;
                              }
                              else {
                                std::
                                vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>
                                ::emplace_back<std::shared_ptr<mocker::ir::Phi>>
                                          ((vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>
                                            *)&p,&phi);
                                idx = (long)&((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                               *)idx)->_M_ptr + 1;
                              }
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&phi.
                                          super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                            } while (peVar5 != (element_type *)0x0);
                            std::
                            vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                            ::~vector((vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                                       *)&p);
                          }
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&nxtLabel.
                                      super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                          if (peVar3 == (element_type *)0x0) {
                            __assert_fail("false",
                                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                                          ,0x25e,
                                          "std::size_t mocker::ir::Interpreter::executeInst(std::size_t)"
                                         );
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return (size_t)this_00;
}

Assistant:

std::size_t Interpreter::executeInst(std::size_t idx) {
  auto &ar = ars.top();
  auto inst = ar.curFunc.get().insts.at(idx);
#ifdef PRINT_LOG
  std::cerr << fmtInst(inst) << std::endl;
#endif
  auto &func = ar.curFunc;
  if (auto p = dyc<Assign>(inst)) {
    auto operand = readVal(p->getOperand());
    writeReg(p->getDest(), operand);
    return idx + 1;
  }
  if (auto p = dyc<ArithUnaryInst>(inst)) {
    auto operand = readVal(p->getOperand());
    writeReg(p->getDest(),
             p->getOp() == ArithUnaryInst::OpType::Neg ? -operand : ~operand);
    return idx + 1;
  }
  if (auto p = dyc<ArithBinaryInst>(inst)) {
    auto lhs = readVal(p->getLhs()), rhs = readVal(p->getRhs());
    switch (p->getOp()) {
    case ArithBinaryInst::BitOr:
      writeReg(p->getDest(), lhs | rhs);
      break;
    case ArithBinaryInst::BitAnd:
      writeReg(p->getDest(), lhs & rhs);
      break;
    case ArithBinaryInst::Xor:
      writeReg(p->getDest(), lhs ^ rhs);
      break;
    case ArithBinaryInst::Shl:
      writeReg(p->getDest(), lhs << rhs);
      break;
    case ArithBinaryInst::Shr:
      writeReg(p->getDest(), lhs >> rhs);
      break;
    case ArithBinaryInst::Add:
      writeReg(p->getDest(), lhs + rhs);
      break;
    case ArithBinaryInst::Sub:
      writeReg(p->getDest(), lhs - rhs);
      break;
    case ArithBinaryInst::Mul:
      writeReg(p->getDest(), lhs * rhs);
      break;
    case ArithBinaryInst::Div:
      writeReg(p->getDest(), lhs / rhs);
      break;
    case ArithBinaryInst::Mod:
      writeReg(p->getDest(), lhs % rhs);
      break;
    default:
      assert(false);
    }
    return idx + 1;
  }
  if (auto p = dyc<RelationInst>(inst)) {
    auto lhs = readVal(p->getLhs()), rhs = readVal(p->getRhs());
    std::int64_t res;
    switch (p->getOp()) {
    case RelationInst::Eq:
      res = lhs == rhs;
      break;
    case RelationInst::Ne:
      res = lhs != rhs;
      break;
    case RelationInst::Lt:
      res = lhs < rhs;
      break;
    case RelationInst::Gt:
      res = lhs > rhs;
      break;
    case RelationInst::Le:
      res = lhs <= rhs;
      break;
    case RelationInst::Ge:
      res = lhs >= rhs;
      break;
    default:
      assert(false);
    }
    writeReg(p->getDest(), res);
    return idx + 1;
  }
  if (auto p = dyc<Load>(inst)) {
    auto addr = reinterpret_cast<std::int64_t *>(readVal(p->getAddr()));
    auto val = *addr;
    writeReg(p->getDest(), val);
    return idx + 1;
  }
  if (auto p = dyc<Store>(inst)) {
    std::int64_t val = readVal(p->getVal());
    auto addr = reinterpret_cast<std::int64_t *>(readVal(p->getAddr()));
    *addr = val;
    printLog((std::int64_t)addr, val);
    return idx + 1;
  }
  if (auto p = dyc<Alloca>(inst)) {
    auto res = fastMalloc(8);
    writeReg(p->getDest(), res);
    return idx + 1;
  }
  if (auto p = dyc<Malloc>(inst)) {
    auto sz = (std::size_t)readVal(p->getSize());
    auto res = fastMalloc(sz);
    writeReg(p->getDest(), res);
    return idx + 1;
  }
  if (auto p = dyc<Branch>(inst)) {
    auto condition = readVal(p->getCondition());
    auto nxtLabel = condition ? p->getThen() : p->getElse();
    ar.lastBB = ar.curBB;
    ar.curBB = nxtLabel->getID();
    return func.get().label2idx.at(nxtLabel->getID());
  }
  if (auto p = dyc<Jump>(inst)) {
    ar.lastBB = ar.curBB;
    ar.curBB = p->getLabel()->getID();
    return func.get().label2idx.at(p->getLabel()->getID());
  }
  if (auto p = dyc<Ret>(inst)) {
    if (p->getVal())
      ars.top().retVal = readVal(p->getVal());
    return func.get().insts.size();
  }
  if (auto p = dyc<Call>(inst)) {
    std::vector<std::int64_t> args;
    for (auto &argReg : p->getArgs())
      args.emplace_back(readVal(argReg));
    auto val = executeFunc(p->getFuncName(), args);
    if (p->getDest())
      writeReg(p->getDest(), val);
    return idx + 1;
  }
  if (auto p = dyc<Phi>(inst)) {
    std::vector<std::shared_ptr<Phi>> phis;
    while (true) {
      auto phi = dyc<Phi>(ar.curFunc.get().insts.at(idx));
      if (!phi) {
        executePhis(phis);
        return idx;
      }
      phis.emplace_back(std::move(phi));
      ++idx;
    }
  }
  assert(false);
}